

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Base_ptr p_Var1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  _Alloc_hider _Var4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  _State_baseV2 *__tmp;
  char *pcVar8;
  iterator iVar9;
  _Base_ptr p_Var10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Result_base *p_Var12;
  long lVar13;
  _Rb_tree_node_base *p_Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  ostream *poVar16;
  ulong uVar17;
  _Base_ptr p_Var18;
  ulong uVar19;
  _Rb_tree_header *p_Var20;
  long lVar21;
  ulong uVar22;
  int j;
  int iVar23;
  int i;
  int iVar24;
  pair<int,_int> pVar25;
  long lVar26;
  key_type *__k;
  uint uVar27;
  pair<int,_int> pVar28;
  _Rb_tree_header *p_Var29;
  undefined1 auVar30 [32];
  shared_ptr<std::__future_base::_State_baseV2> __state;
  char **matrix;
  indexArrayType indexArray;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futArr;
  adjacencyType DFA;
  adjacencyType RFA;
  __m256i ik;
  startStatesType startStatesRFA;
  finalStatesType finalStatesRFA;
  undefined1 local_250 [8];
  _Alloc_hider _Stack_248;
  undefined1 local_240 [32];
  element_type *local_220;
  char **local_218;
  _Rb_tree_node_base *local_210;
  uint local_204;
  _Base_ptr local_200;
  long *local_1f8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_1f0;
  int local_1d4;
  __shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  size_type local_1c0;
  ulong local_1b0;
  ulong local_1a8;
  vector<edge,_std::allocator<edge>_> local_1a0;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_180;
  undefined1 local_160 [16];
  pointer local_150;
  undefined1 local_140 [16];
  pointer local_130;
  time_point local_128;
  long local_120;
  ulong local_118;
  long local_110;
  char *local_108;
  _Rb_tree_header *local_100;
  key_type *local_f8;
  __basic_future<void> local_f0;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  _Rb_tree<int,_std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_88;
  
  local_140 = (undefined1  [16])0x0;
  local_130 = (pointer)0x0;
  p_Var29 = &local_b8._M_impl.super__Rb_tree_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var29->_M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var29->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)local_250,argv[1],(allocator *)&local_e0);
  readRFA((string *)local_250,(adjacencyType *)local_140,(startStatesType *)&local_b8,
          (finalStatesType *)&local_88,&numOfStatesRFA);
  if (local_250 != (undefined1  [8])local_240) {
    operator_delete((void *)local_250,local_240._0_8_ + 1);
  }
  local_150 = (pointer)0x0;
  local_160 = (undefined1  [16])0x0;
  local_1c0 = 0;
  local_1d0._M_ptr = (element_type *)0x0;
  local_1d0._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)local_250,argv[2],(allocator *)&local_e0);
  readDFA((string *)local_250,(adjacencyType *)local_160,&numOfStatesDFA,
          (vector<edge,_std::allocator<edge>_> *)&local_1d0);
  if (local_250 != (undefined1  [8])local_240) {
    operator_delete((void *)local_250,local_240._0_8_ + 1);
  }
  uVar17 = (long)numOfStatesRFA * (long)numOfStatesDFA;
  matrixSize = (int)uVar17;
  uVar6 = matrixSize + 0x1f;
  if (-1 < matrixSize) {
    uVar6 = matrixSize;
  }
  uVar22 = 0xffffffffffffffff;
  if (-1 < matrixSize) {
    uVar22 = uVar17 * 8;
  }
  uVar19 = (ulong)((uVar6 & 0xffffffe0) + 0x20);
  if (matrixSize == (uVar6 & 0xffffffe0)) {
    uVar19 = uVar17 & 0xffffffff;
  }
  local_218 = (char **)operator_new__(uVar22);
  iVar7 = (int)uVar19;
  local_1b0 = uVar19;
  if (0 < matrixSize) {
    lVar26 = 0;
    do {
      pcVar8 = (char *)operator_new__((long)iVar7);
      local_218[lVar26] = pcVar8;
      if (0 < iVar7) {
        memset(local_218[lVar26],0,local_1b0);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < matrixSize);
  }
  local_128.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if ((_Rb_tree_header *)local_b8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var29) {
    p_Var10 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var18 = p_Var10[1]._M_parent;
      local_200 = p_Var10[1]._M_left;
      local_210 = p_Var10;
      if (p_Var18 != local_200) {
        local_220 = (element_type *)CONCAT44(local_220._4_4_,p_Var10[1]._M_color);
        do {
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::find(&local_88,(key_type *)p_Var18);
          p_Var1 = iVar9._M_node[2]._M_parent;
          for (p_Var10 = *(_Base_ptr *)(iVar9._M_node + 2); p_Var10 != p_Var1;
              p_Var10 = (_Base_ptr)&p_Var10->field_0x4) {
            if (((_Rb_tree_color)local_220 == p_Var10->_M_color) && (0 < numOfStatesDFA)) {
              iVar24 = 0;
              do {
                insertToFiniteAutomation((adjacencyType *)local_160,iVar24,iVar24,(string *)p_Var18)
                ;
                iVar24 = iVar24 + 1;
              } while (iVar24 < numOfStatesDFA);
            }
          }
          p_Var18 = p_Var18 + 1;
        } while (p_Var18 != local_200);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(local_210);
    } while ((_Rb_tree_header *)p_Var10 != &local_b8._M_impl.super__Rb_tree_header);
  }
  uVar6 = std::thread::hardware_concurrency();
  local_204 = (uint)matrixSize / uVar6;
  local_e0 = 0x101010101010101;
  uStack_d8 = 0x101010101010101;
  uStack_d0 = 0x101010101010101;
  uStack_c8 = 0x101010101010101;
  local_1f0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            (&local_1f0,(ulong)(uint)(numOfStatesRFA * numOfStatesDFA));
  if (0 < numOfStatesDFA) {
    pVar28.first = 0;
    pVar28.second = 0;
    do {
      if (0 < numOfStatesRFA) {
        lVar26 = 0;
        pVar25 = pVar28;
        do {
          local_250 = (undefined1  [8])pVar25;
          if (local_1f0.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              local_1f0.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_1f0,
                       (iterator)
                       local_1f0.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(pair<int,_int> *)local_250);
          }
          else {
            *local_1f0.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish = pVar25;
            local_1f0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_1f0.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          lVar26 = lVar26 + 1;
          pVar25 = (pair<int,_int>)((long)pVar25 + 0x100000000);
        } while (lVar26 < numOfStatesRFA);
      }
      pVar28 = (pair<int,_int>)((long)pVar28 + 1);
    } while ((long)pVar28 < (long)numOfStatesDFA);
  }
  uVar6 = uVar6 - 1;
  local_118 = (ulong)uVar6;
  local_1d4 = local_204 * uVar6;
  local_120 = (long)local_1d4;
  local_110 = local_118 << 4;
  while( true ) {
    updateMatrix((vector<edge,_std::allocator<edge>_> *)&local_1d0,(adjacencyType *)local_140,
                 local_218);
    local_180.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_180.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_180.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
              (&local_180,local_118);
    if (uVar6 != 0) {
      iVar24 = 0;
      uVar27 = uVar6;
      do {
        local_250 = (undefined1  [8])0x0;
        _Stack_248._M_p = (pointer)0x0;
        _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
        (_Var11._M_pi)->_M_use_count = 1;
        (_Var11._M_pi)->_M_weak_count = 1;
        (_Var11._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00122b00;
        local_220 = (element_type *)(_Var11._M_pi + 1);
        _Var11._M_pi[2]._M_use_count = 0;
        _Var11._M_pi[1]._M_use_count = 0;
        _Var11._M_pi[1]._M_weak_count = 0;
        *(undefined8 *)((long)&_Var11._M_pi[1]._M_weak_count + 1) = 0;
        _Var11._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        _Var11._M_pi[3]._M_use_count = 0;
        _Var11._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00122b50;
        p_Var12 = (_Result_base *)operator_new(0x10);
        *(undefined1 (*) [16])p_Var12 = (undefined1  [16])0x0;
        std::__future_base::_Result_base::_Result_base(p_Var12);
        iVar23 = iVar24 * local_204;
        *(undefined ***)p_Var12 = &PTR__M_destroy_00122d08;
        _Var11._M_pi[4]._vptr__Sp_counted_base = (_func_int **)p_Var12;
        _Var11._M_pi[4]._M_use_count = local_204;
        _Var11._M_pi[4]._M_weak_count = iVar23;
        _Var11._M_pi[5]._vptr__Sp_counted_base = (_func_int **)&local_218;
        *(undefined8 **)&_Var11._M_pi[5]._M_use_count = &local_e0;
        *(int *)&_Var11._M_pi[6]._vptr__Sp_counted_base = iVar7;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_1a0.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.
                       super__Vector_impl_data._M_finish;
        local_1a0.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.super__Vector_impl_data.
        _0_16_ = auVar3 << 0x40;
        local_1f8 = (long *)operator_new(0x20);
        *local_1f8 = (long)&PTR___State_00122ba8;
        local_1f8[1] = (long)local_220;
        local_1f8[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/IvanTyulyandin[P]challenge/main.cpp:142:28),_int,_int>_>,_void>
                             ::_M_run;
        local_1f8[3] = 0;
        std::thread::_M_start_thread(&local_1a0,&local_1f8,0);
        if (local_1f8 != (long *)0x0) {
          (**(code **)(*local_1f8 + 8))();
        }
        if (_Var11._M_pi[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
          std::terminate();
        }
        _Var11._M_pi[3]._vptr__Sp_counted_base =
             (_func_int **)
             local_1a0.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.
             super__Vector_impl_data._M_start;
        _Var4._M_p = _Stack_248._M_p;
        _Stack_248._M_p = (pointer)_Var11._M_pi;
        local_250 = (undefined1  [8])local_220;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p);
        }
        if ((pair<int,_int>)local_250 == (pair<int,_int>)0x0) {
          _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
          local_220 = (element_type *)CONCAT44(local_220._4_4_,uVar27);
          (_Var11._M_pi)->_M_use_count = 1;
          (_Var11._M_pi)->_M_weak_count = 1;
          (_Var11._M_pi)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_00122be8;
          _Var11._M_pi[2]._M_use_count = 0;
          _Var11._M_pi[1]._M_use_count = 0;
          _Var11._M_pi[1]._M_weak_count = 0;
          *(undefined8 *)((long)&_Var11._M_pi[1]._M_weak_count + 1) = 0;
          _Var11._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00122c38;
          p_Var12 = (_Result_base *)operator_new(0x10);
          *(undefined1 (*) [16])p_Var12 = (undefined1  [16])0x0;
          std::__future_base::_Result_base::_Result_base(p_Var12);
          *(undefined ***)p_Var12 = &PTR__M_destroy_00122d08;
          _Var11._M_pi[3]._vptr__Sp_counted_base = (_func_int **)p_Var12;
          _Var11._M_pi[3]._M_use_count = local_204;
          _Var11._M_pi[3]._M_weak_count = iVar23;
          _Var11._M_pi[4]._vptr__Sp_counted_base = (_func_int **)&local_218;
          *(undefined8 **)&_Var11._M_pi[4]._M_use_count = &local_e0;
          *(int *)&_Var11._M_pi[5]._vptr__Sp_counted_base = iVar7;
          _Var4._M_p = _Stack_248._M_p;
          _Stack_248._M_p = (pointer)_Var11._M_pi;
          local_250 = (undefined1  [8])(_Var11._M_pi + 1);
          uVar27 = (_Rb_tree_color)local_220;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p);
          }
        }
        std::__basic_future<void>::__basic_future(&local_f0,(__state_type *)local_250);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_248._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_248._M_p);
        }
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_180,
                   (future<void> *)&local_f0);
        if (local_f0._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f0._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        iVar24 = iVar24 + 1;
        uVar27 = uVar27 - 1;
      } while (uVar27 != 0);
    }
    iVar24 = matrixSize;
    lVar13 = (long)matrixSize;
    lVar26 = local_120;
    if (0 < matrixSize - local_1d4) {
      do {
        if (0 < iVar24) {
          lVar21 = 0;
          do {
            if ((0 < iVar7) && (pcVar8 = local_218[lVar21], pcVar8[lVar26] != '\0')) {
              uVar17 = 0;
              do {
                auVar30._8_8_ = uStack_d8;
                auVar30._0_8_ = local_e0;
                auVar30._16_8_ = uStack_d0;
                auVar30._24_8_ = uStack_c8;
                auVar30 = vpternlogq_avx512vl(auVar30,*(undefined1 (*) [32])(pcVar8 + uVar17),
                                              *(undefined1 (*) [32])(local_218[lVar26] + uVar17),
                                              0xec);
                *(undefined1 (*) [32])(pcVar8 + uVar17) = auVar30;
                uVar17 = uVar17 + 0x20;
              } while (uVar17 < local_1b0);
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 != lVar13);
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < lVar13);
    }
    if (uVar6 != 0) {
      lVar26 = 0;
      do {
        std::future<void>::get
                  ((future<void> *)
                   ((long)&((local_180.
                             super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super___basic_future<void>)
                           ._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar26));
        lVar26 = lVar26 + 0x10;
      } while (local_110 != lVar26);
    }
    local_240._0_8_ = local_1c0;
    _local_250 = local_1d0;
    local_1a0.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1d0._M_ptr = (element_type *)0x0;
    local_1d0._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1c0 = 0;
    local_1a0.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1a0.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<edge,_std::allocator<edge>_>::~vector
              ((vector<edge,_std::allocator<edge>_> *)local_250);
    std::vector<edge,_std::allocator<edge>_>::~vector(&local_1a0);
    if (matrixSize < 1) break;
    p_Var14 = (_Rb_tree_node_base *)0x0;
    local_1a8 = 0;
    do {
      p_Var29 = &local_b8._M_impl.super__Rb_tree_header;
      iVar24 = local_1f0.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)p_Var14].second;
      p_Var18 = &p_Var29->_M_header;
      for (p_Var10 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var10 != (_Rb_tree_header *)0x0;
          p_Var10 = (&p_Var10->_M_left)[(int)*(size_t *)(p_Var10 + 1) < iVar24]) {
        if (iVar24 <= (int)*(size_t *)(p_Var10 + 1)) {
          p_Var18 = p_Var10;
        }
      }
      p_Var20 = p_Var29;
      if (((_Rb_tree_header *)p_Var18 != p_Var29) &&
         (p_Var20 = (_Rb_tree_header *)p_Var18,
         iVar24 < (int)((_Rb_tree_header *)p_Var18)->_M_node_count)) {
        p_Var20 = p_Var29;
      }
      local_210 = p_Var14;
      if ((p_Var20 != p_Var29) && (0 < matrixSize)) {
        local_108 = local_218[(long)p_Var14];
        p_Var10 = (_Base_ptr)0x0;
        local_100 = p_Var20;
        do {
          local_200 = p_Var10;
          if (local_108[(long)p_Var10] != '\0') {
            __k = *(key_type **)(p_Var20 + 1);
            local_f8 = *(key_type **)((long)(p_Var20 + 1) + 8);
            if (__k != local_f8) {
              local_220 = (element_type *)
                          CONCAT44(local_220._4_4_,
                                   local_1f0.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)p_Var10].second);
              do {
                iVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::find(&local_88,__k);
                if ((_Rb_tree_header *)iVar9._M_node != &local_88._M_impl.super__Rb_tree_header) {
                  p_Var18 = iVar9._M_node[2]._M_parent;
                  for (p_Var10 = *(_Base_ptr *)(iVar9._M_node + 2); p_Var10 != p_Var18;
                      p_Var10 = (_Base_ptr)&p_Var10->field_0x4) {
                    if (p_Var10->_M_color == (_Rb_tree_color)local_220) {
                      iVar24 = local_1f0.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(long)local_210].first;
                      iVar23 = local_1f0.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(long)local_200].first;
                      bVar5 = insertToFiniteAutomation((adjacencyType *)local_160,iVar24,iVar23,__k)
                      ;
                      if (bVar5) {
                        local_250._4_4_ = iVar23;
                        local_250._0_4_ = iVar24;
                        _Stack_248._M_p = (pointer)(local_240 + 8);
                        pcVar2 = (__k->_M_dataplus)._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)(local_250 + 8),pcVar2,pcVar2 + __k->_M_string_length);
                        std::vector<edge,_std::allocator<edge>_>::emplace_back<edge>
                                  ((vector<edge,_std::allocator<edge>_> *)&local_1d0,
                                   (edge *)local_250);
                        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_240 + 8);
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_248._M_p !=
                            p_Var15) {
                          operator_delete(_Stack_248._M_p,local_240._8_8_ + 1);
                          p_Var15 = extraout_RAX;
                        }
                        local_1a8 = CONCAT71((int7)((ulong)p_Var15 >> 8),1);
                      }
                    }
                  }
                }
                __k = __k + 1;
                p_Var20 = local_100;
              } while (__k != local_f8);
            }
          }
          p_Var10 = (_Base_ptr)((long)&((_Alloc_hider *)&local_200->_M_color)->_M_p + 1);
        } while ((long)p_Var10 < (long)matrixSize);
      }
      p_Var14 = (_Rb_tree_node_base *)((long)&local_210->_M_color + 1);
    } while ((long)p_Var14 < (long)matrixSize);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_180);
    if ((local_1a8 & 1) == 0) {
LAB_0011694a:
      local_250 = (undefined1  [8])local_240;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"");
      getCurTime(local_128,(string *)local_250);
      if (local_250 != (undefined1  [8])local_240) {
        operator_delete((void *)local_250,local_240._0_8_ + 1);
      }
      iVar7 = countResult((adjacencyType *)local_160);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      if (0 < matrixSize) {
        lVar26 = 0;
        do {
          if (local_218[lVar26] != (char *)0x0) {
            operator_delete__(local_218[lVar26]);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 < matrixSize);
      }
      if (local_218 != (char **)0x0) {
        operator_delete__(local_218);
      }
      if (local_1f0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f0.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f0.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f0.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<edge,_std::allocator<edge>_>::~vector
                ((vector<edge,_std::allocator<edge>_> *)&local_1d0);
      std::
      vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
      ::~vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                 *)local_160);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_b8);
      std::
      vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
      ::~vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                 *)local_140);
      return 0;
    }
  }
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_180);
  goto LAB_0011694a;
}

Assistant:

int main(int argc, char* argv[]) {

    adjacencyType RFA;
    startStatesType startStatesRFA;
    finalStatesType finalStatesRFA;
    readRFA(argv[1], RFA, startStatesRFA, finalStatesRFA, numOfStatesRFA);

    adjacencyType DFA;
    vector<edge> newEdges = vector<edge>(0);
    readDFA(argv[2], DFA, numOfStatesDFA, newEdges);

	matrixSize = numOfStatesDFA * numOfStatesRFA;

	int matrixSizeTo32 = matrixSize % 32 == 0 ? matrixSize : matrixSize + (32 - matrixSize % 32); // for AVX2
	auto matrix = new char * [matrixSize];
    for (auto i = 0; i < matrixSize; ++ i) {
        matrix[i] = new char[matrixSizeTo32];
        char * matrixRow = matrix[i];
        for (auto j = 0; j < matrixSizeTo32; ++ j) {
            matrixRow[j] = 0;
        }
    }

	auto start_time = std::chrono::steady_clock::now();

    // add edges to automation, if nonterminal start == end
    for (auto & iter : startStatesRFA) {
        int startGrm = iter.first;
        for (auto & by : iter.second) {
            auto finalsIter = finalStatesRFA.find(by);
            // if it is equal to end iterator => incorrect input
            for (auto finalGrm : finalsIter->second) {
                if (startGrm == finalGrm) {
                    for (auto i = 0; i < numOfStatesDFA; ++ i) {
                        insertToFiniteAutomation(DFA, i, i, by);
                    }
                }
            }
        }
    }

    bool needOneMoreStep = false;


    auto THREADS = std::thread::hardware_concurrency() - 1;
    int step = matrixSize / (THREADS + 1);

    __m256i ik = _mm256_set1_epi8(1); // PogChamp

    auto parallelClosure = [&matrix, &ik, matrixSizeTo32](int startK, int howMuch) {
        int endK = startK + howMuch;
        for (auto k = startK; k < endK; ++ k) {
            for (auto i = 0; i < matrixSize; ++ i) {
                char * matrixRow = matrix[i];
                if (matrixRow[k]) {
					for (auto j = 0; j < matrixSizeTo32; j += 32) {
						__m256i ij = _mm256_loadu_si256((__m256i const *) &matrixRow[j]);
						__m256i kj = _mm256_loadu_si256((__m256i const *) &matrix[k][j]);

						_mm256_storeu_si256((__m256i *) &matrixRow[j], _mm256_or_si256(ij, _mm256_and_si256(ik, kj)));
					}
//					for (auto j = 0; j < matrixSize; ++ j) {
//						if (matrix[k][j]) {
//							matrixRow[j] = true;
//						}
//					}
                }
            }
        }
    };

	indexArrayType indexArray;
	indexArray.reserve(static_cast<unsigned int>(numOfStatesDFA * numOfStatesRFA));

	for (int i = 0; i < numOfStatesDFA; ++ i) {
		for (int j = 0; j < numOfStatesRFA; ++ j) {
			indexArray.emplace_back(make_pair(i, j));
		}
	}

    do {
        needOneMoreStep = false;

        // stage 1: add info about new edges to matrix
        updateMatrix(newEdges, RFA, matrix);

        //getCurTime(start_time, "1 stage done");


        vector<future<void>> futArr;
        futArr.reserve(THREADS);
        for (auto i = 0; i < THREADS; ++ i) {
            futArr.emplace_back(std::async(launch::async, parallelClosure, i * step, step));
        }

        parallelClosure(THREADS * step, matrixSize - THREADS * step);

        for (auto i = 0; i < THREADS; ++ i) {
            futArr[i].get();
        }

        // stage 2: closure
        //getCurTime(start_time, "2 stage done");

		//cout << countResult(DFA) << " before\n";
        newEdges = vector<edge>(0);
        for (auto i = 0; i < matrixSize; ++ i) {
            char * matrixRow = matrix[i];
            int startGrm = indexArray[i].second;
            auto nonTermStartIter = startStatesRFA.find(startGrm);
            if (nonTermStartIter != startStatesRFA.end()) {
                for (auto j = 0; j < matrixSize; ++ j) {
                    if (matrixRow[j]) {
                        int finalGrm = indexArray[j].second;
                        for (auto & nonTerm : nonTermStartIter->second) {
                            auto nonTermFinalIter = finalStatesRFA.find(nonTerm);
                            if (nonTermFinalIter != finalStatesRFA.end()) {
                                for (auto finalStateForNonTerm : nonTermFinalIter->second) {
                                    if (finalStateForNonTerm == finalGrm) {
                                        int startDFA = indexArray[i].first;
                                        int finalDFA = indexArray[j].first;
                                        if (insertToFiniteAutomation(DFA, startDFA, finalDFA, nonTerm)) {
											newEdges.emplace_back(move(edge(startDFA, finalDFA, nonTerm)));
											needOneMoreStep = true;
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }

        }
        //getCurTime(start_time, "3 stage done");
		//cout << countResult(DFA) << " after\n";
    } while (needOneMoreStep);

    getCurTime(start_time, "");
    cout << countResult(DFA) << "\n";

    for (auto i = 0; i < matrixSize; ++ i) {
    	delete[](matrix[i]);
    }
    delete[](matrix);

}